

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skins.cpp
# Opt level: O2

bool __thiscall
CSkins::ValidateSkinParts
          (CSkins *this,char **apPartNames,int *pUseCustomColors,int *pPartColors,int GameFlags)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long in_FS_OFFSET;
  float fVar5;
  float fVar6;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 aVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  vec3 vVar11;
  vec3 HSL;
  vec3 HSL_00;
  vector3_base<float> local_40;
  vector3_base<float> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((GameFlags & 1U) == 0) {
    uVar4 = *pPartColors;
    uVar1 = pPartColors[5];
    fVar5 = 0.0;
    fVar6 = 0.0;
    if (*pUseCustomColors != 0) {
      fVar5 = (float)(uVar4 >> 0x10 & 0xff) / 255.0;
      fVar6 = (float)(uVar4 >> 8 & 0xff) / 255.0;
    }
    fVar10 = (float)(uVar1 >> 0x10 & 0xff) / 255.0;
    fVar8 = (float)(uVar1 >> 8 & 0xff) / 255.0;
    if (*pUseCustomColors == 0) {
      aVar7.z = 1.0;
    }
    else {
      aVar7.z = (float)(uVar4 & 0xff) / 255.0;
    }
    fVar9 = (float)(uVar1 & 0xff) / 255.0;
    vVar11.field_1.y = fVar6;
    vVar11.field_0.x = fVar5;
    vVar11.field_2.z = aVar7.z;
    vVar11 = HslToRgb(vVar11);
    vVar11 = RgbToLab(vVar11);
    local_30.field_2 = vVar11.field_2;
    local_30._0_8_ = vVar11._0_8_;
    iVar3 = str_comp(apPartNames[5],"negative");
    if (iVar3 == 0) {
      if (pUseCustomColors[5] == 0) {
        fVar9 = 1.0;
        fVar8 = 0.0;
        fVar10 = 0.0;
      }
      HSL_00.field_2.z = fVar9 * 0.925;
      HSL_00.field_1.y = fVar8;
      HSL_00.field_0.x = fVar10;
      vVar11 = HslToRgb(HSL_00);
      vVar11 = RgbToLab(vVar11);
      local_40.field_2 = vVar11.field_2;
      local_40._0_8_ = vVar11._0_8_;
      fVar5 = distance<float>(&local_30,&local_40);
      if (fVar5 < 80.0) {
        fVar9 = fVar9 + -0.22;
        fVar5 = 1.0;
        if (fVar9 <= 1.0) {
          fVar5 = fVar9;
        }
        fVar5 = (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar5);
        if (0.23921569 <= fVar5) {
          pUseCustomColors[5] = 1;
          uVar4 = (int)(fVar8 * 255.0) << 8 | (int)(fVar10 * 255.0) << 0x10;
          fVar5 = fVar5 * 255.0;
          goto LAB_0016f48e;
        }
        goto LAB_0016f43e;
      }
    }
    else {
      iVar3 = str_comp(apPartNames[5],"colorable");
      if (iVar3 == 0) {
        fVar5 = 0.0;
        fVar6 = 0.0;
        if (pUseCustomColors[5] != 0) {
          fVar5 = fVar10;
          fVar6 = fVar8;
        }
        fVar8 = 1.0;
        if (pUseCustomColors[5] != 0) {
          fVar8 = fVar9;
        }
        aVar7.z = 1.0;
        if (fVar8 * 0.0823 <= 1.0) {
          aVar7.z = fVar8 * 0.0823;
        }
        HSL.field_1.y = fVar6;
        HSL.field_0.x = fVar5;
        HSL.field_2.z = aVar7.z;
        vVar11 = HslToRgb(HSL);
        vVar11 = RgbToLab(vVar11);
        local_40.field_2 = vVar11.field_2;
        local_40._0_8_ = vVar11._0_8_;
        fVar10 = distance<float>(&local_30,&local_40);
        if (fVar10 < 80.0) {
          fVar8 = fVar8 + -0.6;
          fVar10 = 1.0;
          if (fVar8 <= 1.0) {
            fVar10 = fVar8;
          }
          pUseCustomColors[5] = 1;
          uVar4 = (int)(fVar6 * 255.0) << 8 | (int)(fVar5 * 255.0) << 0x10;
          fVar5 = (float)(~-(uint)(fVar8 < 0.0) & (uint)(fVar10 * 255.0));
LAB_0016f48e:
          pPartColors[5] = (int)fVar5 | uVar4;
          goto LAB_0016f493;
        }
      }
    }
    bVar2 = true;
  }
  else {
    iVar3 = str_comp(apPartNames[5],"colorable");
    if (iVar3 != 0) {
      iVar3 = str_comp(apPartNames[5],"negative");
      bVar2 = true;
      if (iVar3 != 0) goto LAB_0016f495;
    }
LAB_0016f43e:
    str_copy(apPartNames[5],"standard",0x61);
LAB_0016f493:
    bVar2 = false;
  }
LAB_0016f495:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CSkins::ValidateSkinParts(char *apPartNames[NUM_SKINPARTS], int *pUseCustomColors, int *pPartColors, int GameFlags) const
{
	// force standard (black) eyes on team skins
	if(GameFlags&GAMEFLAG_TEAMS)
	{
		// TODO: adjust eye color here as well?
		if(str_comp(apPartNames[SKINPART_EYES], "colorable") == 0 || str_comp(apPartNames[SKINPART_EYES], "negative") == 0)
		{
			str_copy(apPartNames[SKINPART_EYES], "standard", MAX_SKIN_ARRAY_SIZE);
			return false;
		}
	}
	else
	{
		const int BodyColor = pPartColors[SKINPART_BODY];
		const int EyeColor = pPartColors[SKINPART_EYES];

		vec3 BodyHsl(((BodyColor>>16)&0xff)/255.0f, ((BodyColor>>8)&0xff)/255.0f, (BodyColor&0xff)/255.0f);
		vec3 EyeHsl(((EyeColor>>16)&0xff)/255.0f, ((EyeColor>>8)&0xff)/255.0f, (EyeColor&0xff)/255.0f);

		if(!pUseCustomColors[SKINPART_BODY])
			BodyHsl = vec3(0, 0, 1);

		const vec3 BodyLab = RgbToLab(HslToRgb(BodyHsl));

		if(str_comp(apPartNames[SKINPART_EYES], "negative") == 0)
		{
			if(!pUseCustomColors[SKINPART_EYES])
				EyeHsl = vec3(0, 0, 1);

			vec3 OrgEyeHsl = EyeHsl;
			EyeHsl.l *= 0.925f;

			const vec3 EyeLab = RgbToLab(HslToRgb(EyeHsl));
			if(distance(BodyLab, EyeLab) < MIN_EYE_BODY_COLOR_DIST)
			{
				OrgEyeHsl.l = clamp(OrgEyeHsl.l - 0.22f, 0.f, 1.f);

				// white eye can't go to black because of our DARKEST_COLOR_LGT restriction, so switch to standard (black) eyes
				if(OrgEyeHsl.l < DARKEST_COLOR_LGT/255.f)
					str_copy(apPartNames[SKINPART_EYES], "standard", MAX_SKIN_ARRAY_SIZE); // black
				else
				{
					pUseCustomColors[SKINPART_EYES] = 1;
					pPartColors[SKINPART_EYES] = (int(OrgEyeHsl.h*255) << 16) | (int(OrgEyeHsl.s*255) << 8) | (int(OrgEyeHsl.l*255));
				}

				return false;
			}
		}
		else if(str_comp(apPartNames[SKINPART_EYES], "colorable") == 0)
		{
			if(!pUseCustomColors[SKINPART_EYES])
				EyeHsl = vec3(0, 0, 1);

			vec3 OrgEyeHsl = EyeHsl;
			EyeHsl.l = clamp(EyeHsl.l * 0.0823f, 0.f, 1.f);

			const vec3 EyeLab = RgbToLab(HslToRgb(EyeHsl));
			if(distance(BodyLab, EyeLab) < MIN_EYE_BODY_COLOR_DIST)
			{
				OrgEyeHsl.l -= 0.6f;
				OrgEyeHsl.l = clamp(OrgEyeHsl.l, 0.f, 1.f);

				pUseCustomColors[SKINPART_EYES] = 1;
				pPartColors[SKINPART_EYES] = (int(OrgEyeHsl.h*255) << 16) | (int(OrgEyeHsl.s*255) << 8) | (int(OrgEyeHsl.l*255));

				return false;
			}
		}
	}

	return true;
}